

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

index_t __thiscall
GEO::PeriodicDelaunay3dThread::new_tetrahedron
          (PeriodicDelaunay3dThread *this,signed_index_t v1,signed_index_t v2,signed_index_t v3,
          signed_index_t v4)

{
  index_t iVar1;
  int *piVar2;
  index_t result;
  signed_index_t v4_local;
  signed_index_t v3_local;
  signed_index_t v2_local;
  signed_index_t v1_local;
  PeriodicDelaunay3dThread *this_local;
  
  iVar1 = new_tetrahedron(this);
  piVar2 = vector<int>::operator[](this->cell_to_v_store_,iVar1 << 2);
  *piVar2 = v1;
  piVar2 = vector<int>::operator[](this->cell_to_v_store_,iVar1 * 4 + 1);
  *piVar2 = v2;
  piVar2 = vector<int>::operator[](this->cell_to_v_store_,iVar1 * 4 + 2);
  *piVar2 = v3;
  piVar2 = vector<int>::operator[](this->cell_to_v_store_,iVar1 * 4 + 3);
  *piVar2 = v4;
  return iVar1;
}

Assistant:

index_t new_tetrahedron(
            signed_index_t v1, signed_index_t v2, 
            signed_index_t v3, signed_index_t v4
        ) {
            index_t result = new_tetrahedron();
            cell_to_v_store_[4 * result] = v1;
            cell_to_v_store_[4 * result + 1] = v2;
            cell_to_v_store_[4 * result + 2] = v3;
            cell_to_v_store_[4 * result + 3] = v4;
            return result;
        }